

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_korax.cpp
# Opt level: O0

int AF_A_KoraxChase(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *this;
  DObject *this_00;
  int iVar1;
  int iVar2;
  AActor *pAVar3;
  AActor *pAVar4;
  bool bVar5;
  bool local_c6;
  bool local_c3;
  TAngle<double> local_c0;
  DVector3 local_b8;
  undefined1 local_a0 [8];
  FActorIterator iterator_1;
  TAngle<double> local_88;
  DVector3 local_80;
  undefined1 local_68 [8];
  FActorIterator iterator;
  AActor *spot;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_korax.cpp"
                  ,0x5b,"int AF_A_KoraxChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar5 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar5 = true, (param->field_0).field_1.atag != 1)) {
    bVar5 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar5) {
    this = *(AActor **)&param->field_0;
    local_c3 = true;
    if (this != (AActor *)0x0) {
      local_c3 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
    }
    if (local_c3 == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_korax.cpp"
                    ,0x5b,"int AF_A_KoraxChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
      bVar5 = false;
      if ((param[1].field_0.field_3.Type == '\x03') &&
         (bVar5 = true, param[1].field_0.field_1.atag != 1)) {
        bVar5 = param[1].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar5) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_korax.cpp"
                      ,0x5b,"int AF_A_KoraxChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      this_00 = (DObject *)param[1].field_0.field_1.a;
      local_c6 = true;
      if (this_00 != (DObject *)0x0) {
        local_c6 = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
      }
      if (local_c6 == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_korax.cpp"
                      ,0x5b,"int AF_A_KoraxChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    if ((2 < numparam) && (param[2].field_0.field_3.Type != 0xff)) {
      bVar5 = false;
      if ((param[2].field_0.field_3.Type == '\x03') &&
         (bVar5 = true, param[2].field_0.field_1.atag != 8)) {
        bVar5 = param[2].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar5) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_korax.cpp"
                      ,0x5b,"int AF_A_KoraxChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    if ((this->special2 == 0) &&
       (iVar2 = this->health, iVar1 = AActor::SpawnHealth(this), iVar2 <= iVar1 / 2)) {
      FActorIterator::FActorIterator((FActorIterator *)local_68,0xf8);
      iterator._8_8_ = FActorIterator::Next((FActorIterator *)local_68);
      if ((AActor *)iterator._8_8_ != (AActor *)0x0) {
        AActor::PosAtZ(&local_80,(AActor *)iterator._8_8_,-2147483648.0);
        TAngle<double>::TAngle(&local_88,(TAngle<double> *)(iterator._8_8_ + 0x90));
        P_Teleport(this,&local_80,&local_88,3);
      }
      P_StartScript(this,(line_t *)0x0,0xf9,(char *)0x0,(int *)0x0,0,0);
      this->special2 = 1;
    }
    else {
      bVar5 = TObjPtr<AActor>::operator==(&this->target,(AActor *)0x0);
      if (!bVar5) {
        iVar2 = FRandom::operator()(&pr_koraxchase);
        if (iVar2 < 0x1e) {
          AActor::SetState(this,this->MissileState,false);
        }
        else {
          iVar2 = FRandom::operator()(&pr_koraxchase);
          if (iVar2 < 0x1e) {
            FSoundID::FSoundID((FSoundID *)&iterator_1.field_0xc,"KoraxActive");
            S_Sound(this,2,(FSoundID *)&iterator_1.field_0xc,1.0,0.0);
          }
        }
        iVar2 = this->health;
        iVar1 = AActor::SpawnHealth(this);
        if ((iVar2 < iVar1 >> 1) && (iVar2 = FRandom::operator()(&pr_koraxchase), iVar2 < 10)) {
          FActorIterator::FActorIterator((FActorIterator *)local_a0,0xf9);
          bVar5 = TObjPtr<AActor>::operator!=(&this->tracer,(AActor *)0x0);
          if (bVar5) {
            do {
              pAVar3 = FActorIterator::Next((FActorIterator *)local_a0);
              bVar5 = false;
              iterator._8_8_ = pAVar3;
              if (pAVar3 != (AActor *)0x0) {
                pAVar4 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->tracer);
                bVar5 = pAVar3 != pAVar4;
              }
            } while (bVar5);
          }
          iterator._8_8_ = FActorIterator::Next((FActorIterator *)local_a0);
          TObjPtr<AActor>::operator=(&this->tracer,(AActor *)iterator._8_8_);
          if (iterator._8_8_ != 0) {
            AActor::PosAtZ(&local_b8,(AActor *)iterator._8_8_,-2147483648.0);
            TAngle<double>::TAngle(&local_c0,(TAngle<double> *)(iterator._8_8_ + 0x90));
            P_Teleport(this,&local_b8,&local_c0,3);
          }
        }
      }
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_korax.cpp"
                ,0x5b,"int AF_A_KoraxChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_KoraxChase)
{
	PARAM_ACTION_PROLOGUE;

	AActor *spot;

	if ((!self->special2) && (self->health <= (self->SpawnHealth()/2)))
	{
		FActorIterator iterator (KORAX_FIRST_TELEPORT_TID);
		spot = iterator.Next ();
		if (spot != NULL)
		{
			P_Teleport (self, spot->PosAtZ(ONFLOORZ), spot->Angles.Yaw, TELF_SOURCEFOG | TELF_DESTFOG);
		}

		P_StartScript (self, NULL, 249, NULL, NULL, 0, 0);
		self->special2 = 1;	// Don't run again

		return 0;
	}

	if (self->target == NULL)
	{
		return 0;
	}
	if (pr_koraxchase()<30)
	{
		self->SetState (self->MissileState);
	}
	else if (pr_koraxchase()<30)
	{
		S_Sound (self, CHAN_VOICE, "KoraxActive", 1, ATTN_NONE);
	}

	// Teleport away
	if (self->health < (self->SpawnHealth()>>1))
	{
		if (pr_koraxchase()<10)
		{
			FActorIterator iterator (KORAX_TELEPORT_TID);

			if (self->tracer != NULL)
			{	// Find the previous teleport destination
				do
				{
					spot = iterator.Next ();
				} while (spot != NULL && spot != self->tracer);
			}

			// Go to the next teleport destination
			spot = iterator.Next ();
			self->tracer = spot;
			if (spot)
			{
				P_Teleport (self, spot->PosAtZ(ONFLOORZ), spot->Angles.Yaw, TELF_SOURCEFOG | TELF_DESTFOG);
			}
		}
	}
	return 0;
}